

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O2

bool clusterSimple(TSimilarityMap *sim,TValueCC tholdCC,TKeyPressCollection *keyPresses)

{
  double *pdVar1;
  pointer psVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  TClusterId *pTVar10;
  ulong uVar11;
  int iVar12;
  TClusterId *pTVar13;
  ulong uVar14;
  int iter;
  int iVar15;
  bool bVar16;
  float fVar17;
  
  psVar2 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = ((long)(keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)psVar2) / 0x30;
  lVar6 = 0;
  iVar12 = (int)uVar5;
  uVar9 = 0;
  if (0 < iVar12) {
    uVar9 = uVar5 & 0xffffffff;
  }
  for (; uVar9 * 0x30 - lVar6 != 0; lVar6 = lVar6 + 0x30) {
    *(undefined4 *)((long)&psVar2->cid + lVar6) = 0;
  }
  iVar8 = 0;
  for (iVar15 = 0; iVar15 != 1000000; iVar15 = iVar15 + 1) {
    do {
      iVar3 = rand();
      iVar4 = rand();
      iVar3 = iVar3 % iVar12;
      iVar4 = iVar4 % iVar12;
    } while (iVar3 == iVar4);
    lVar6 = *(long *)&(sim->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[iVar3].
                      super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                      super__Vector_impl_data;
    lVar7 = (long)iVar4 * 0x10;
    pdVar1 = (double *)(lVar6 + lVar7);
    if (tholdCC < *pdVar1 || tholdCC == *pdVar1) {
      psVar2 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar17 = frand();
      if ((double)fVar17 < *(double *)(lVar6 + lVar7)) {
        pTVar10 = &psVar2[iVar3].cid;
        pTVar13 = &psVar2[iVar4].cid;
        iVar3 = *pTVar10;
        if (*pTVar13 == 0 && iVar3 == 0) {
          iVar8 = iVar8 + 1;
          *pTVar13 = iVar8;
          *pTVar10 = iVar8;
        }
        else if (iVar3 == 0) {
          *pTVar10 = *pTVar13;
        }
        else {
          *pTVar13 = iVar3;
        }
      }
    }
  }
  psVar2 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar6 = 0; uVar9 * 0x30 != lVar6; lVar6 = lVar6 + 0x30) {
    iVar12 = *(int *)((long)&psVar2->cid + lVar6);
    iVar15 = iVar8 + 1;
    if (iVar12 == 0) {
      iVar8 = iVar15;
      iVar12 = iVar15;
    }
    *(int *)((long)&psVar2->cid + lVar6) = -iVar12;
  }
  psVar2 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar5 = uVar5 & 0xffffffff;
  pTVar10 = &psVar2->cid;
  iVar12 = 0;
  for (uVar11 = 0; uVar11 != uVar9; uVar11 = uVar11 + 1) {
    if (psVar2[uVar11].cid < 1) {
      pTVar13 = pTVar10;
      uVar14 = uVar5;
      while (bVar16 = uVar14 != 0, uVar14 = uVar14 - 1, bVar16) {
        if (*pTVar13 == psVar2[uVar11].cid) {
          *pTVar13 = iVar12;
        }
        pTVar13 = pTVar13 + 0xc;
      }
      iVar12 = iVar12 + 1;
    }
    uVar5 = uVar5 - 1;
    pTVar10 = pTVar10 + 0xc;
  }
  return true;
}

Assistant:

bool clusterSimple(const TSimilarityMap & sim, TValueCC tholdCC, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = 0;
    }

    int curId = 0;

    int nIter = 1000000;
    for (int iter = 0; iter < nIter; ++iter) {
        int i = rand()%n;
        int j = rand()%n;
        while (i == j) {
            i = rand()%n;
            j = rand()%n;
        }

        auto & icid = keyPresses[i].cid;
        auto & jcid = keyPresses[j].cid;

        //if (icid != 0 && jcid != 0) continue;

        auto & cc = sim[i][j].cc;

        if (cc < tholdCC) continue;
        auto r = frand();
        if (r < cc) {
            if (icid == jcid && icid == 0) {
                icid = jcid = ++curId;
            } else if (icid == 0) {
                icid = jcid;
            } else {
                jcid = icid;
            }
        }

        //if (icid == jcid) {
        //    //if (std::pow(r, 1.0) > cc) {
        //    //    icid = i + 1;
        //    //    jcid = j + 1;
        //    //}
        //} else {
        //    if (std::pow(r, 1.0) < cc) {
        //        icid = jcid;
        //    }
        //}
    }

    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid == 0) icid = ++curId;
        icid = -icid;
    }

    curId = 0;
    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid > 0) continue;
        for (int j = i; j < n; ++j) {
            auto & jcid = keyPresses[j].cid;

            if (jcid == icid) {
                jcid = curId;
            }
        }
        ++curId;
    }

    return true;
}